

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O2

void __thiscall
CUI::DoScrollbarOption
          (CUI *this,void *pID,int *pOption,CUIRect *pRect,char *pStr,int Min,int Max,
          IScrollbarScale *pScale,bool Infinite)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  long in_FS_OFFSET;
  float FontSize;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float Current;
  float fVar4;
  CUIRect ScrollBar;
  CUIRect Label;
  char aBuf [128];
  char aBufMax [128];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = *pOption;
  uVar2 = uVar3;
  if (uVar3 == 0) {
    uVar2 = Max + 1U;
  }
  if (Infinite) {
    Max = Max + 1U;
    uVar3 = uVar2;
  }
  str_format(aBufMax,0x80,"%s: %i",pStr,(ulong)(uint)Max);
  if (Infinite && uVar3 == Max) {
    str_format(aBuf,0x80,anon_var_dwarf_12ead4,pStr);
  }
  else {
    str_format(aBuf,0x80,"%s: %i",pStr,(ulong)uVar3);
  }
  FontSize = pRect->h * 0.8 * 0.8;
  (*(this->m_pTextRender->super_IInterface)._vptr_IInterface[6])
            (this->m_pTextRender,aBuf,0xffffffff);
  (*(this->m_pTextRender->super_IInterface)._vptr_IInterface[6])
            (FontSize,this->m_pTextRender,aBufMax,0xffffffff);
  fVar4 = extraout_XMM0_Da;
  if (extraout_XMM0_Da <= extraout_XMM0_Da_00) {
    fVar4 = extraout_XMM0_Da_00;
  }
  Label.x = 0.0;
  Label.y = 0.0;
  Label.w = 0.0;
  Label.h = 0.25;
  CUIRect::Draw(pRect,(vec4 *)&Label,5.0,0xf);
  CUIRect::VSplitLeft(pRect,pRect->h + 10.0 + fVar4,&Label,&ScrollBar);
  CUIRect::VSplitLeft(&Label,Label.h + 5.0,(CUIRect *)0x0,&Label);
  DoLabel(this,&Label,aBuf,FontSize,4,-1.0,true);
  CUIRect::VMargin(&ScrollBar,4.0,&ScrollBar);
  (**pScale->_vptr_IScrollbarScale)
            (pScale,(ulong)uVar3,(ulong)((uint)Infinite + Min),(ulong)(uint)Max);
  DoScrollbarH(this,pID,&ScrollBar,Current);
  uVar2 = (*pScale->_vptr_IScrollbarScale[1])(pScale,(ulong)((uint)Infinite + Min),(ulong)(uint)Max)
  ;
  uVar3 = 0;
  if (!Infinite) {
    uVar3 = uVar2;
  }
  if (uVar2 != Max) {
    uVar3 = uVar2;
  }
  *pOption = uVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CUI::DoScrollbarOption(const void *pID, int *pOption, const CUIRect *pRect, const char *pStr, int Min, int Max, const IScrollbarScale *pScale, bool Infinite)
{
	int Value = *pOption;
	if(Infinite)
	{
		Min += 1;
		Max += 1;
		if(Value == 0)
			Value = Max;
	}

	char aBufMax[128];
	str_format(aBufMax, sizeof(aBufMax), "%s: %i", pStr, Max);
	char aBuf[128];
	if(!Infinite || Value != Max)
		str_format(aBuf, sizeof(aBuf), "%s: %i", pStr, Value);
	else
		str_format(aBuf, sizeof(aBuf), "%s: \xe2\x88\x9e", pStr);

	float FontSize = pRect->h*CUI::ms_FontmodHeight*0.8f;
	float VSplitVal = maximum(TextRender()->TextWidth(FontSize, aBuf, -1), TextRender()->TextWidth(FontSize, aBufMax, -1));

	pRect->Draw(vec4(0.0f, 0.0f, 0.0f, 0.25f));

	CUIRect Label, ScrollBar;
	pRect->VSplitLeft(pRect->h+10.0f+VSplitVal, &Label, &ScrollBar);
	Label.VSplitLeft(Label.h+5.0f, 0, &Label);
	DoLabel(&Label, aBuf, FontSize, TEXTALIGN_ML);

	ScrollBar.VMargin(4.0f, &ScrollBar);
	Value = pScale->ToAbsolute(DoScrollbarH(pID, &ScrollBar, pScale->ToRelative(Value, Min, Max)), Min, Max);
	if(Infinite && Value == Max)
		Value = 0;

	*pOption = Value;
}